

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  vfloat<4> vVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  byte bVar22;
  byte bVar23;
  int iVar24;
  byte bVar25;
  NodeRef root;
  size_t sVar26;
  size_t sVar27;
  byte bVar28;
  long lVar29;
  uint uVar30;
  NodeRef *pNVar31;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar32;
  undefined4 uVar33;
  ulong uVar34;
  bool bVar35;
  byte bVar36;
  ulong uVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  vint4 ai_2;
  undefined1 auVar54 [64];
  vint4 bi;
  undefined1 in_ZMM2 [64];
  vint4 bi_1;
  undefined1 auVar55 [16];
  vint4 bi_3;
  undefined1 auVar56 [16];
  vint4 ai;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vint4 bi_2;
  undefined1 auVar60 [16];
  vint4 ai_1;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  vint4 ai_3;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar74 [64];
  Precalculations pre;
  undefined1 local_3758 [16];
  BVH *local_3740;
  Intersectors *local_3738;
  ulong local_3730;
  int local_3728;
  int iStack_3724;
  int iStack_3720;
  int iStack_371c;
  RTCFilterFunctionNArguments args;
  TravRayK<4,_false> tray;
  undefined1 local_35d8 [16];
  undefined1 local_35c8 [16];
  undefined1 local_35b8 [16];
  undefined1 local_35a8 [16];
  undefined1 local_3598 [16];
  undefined1 local_3588 [8];
  float fStack_3580;
  float fStack_357c;
  undefined1 local_3578 [8];
  float fStack_3570;
  float fStack_356c;
  undefined8 local_3568;
  undefined8 uStack_3560;
  undefined8 local_3558;
  undefined8 uStack_3550;
  undefined1 local_3548 [16];
  undefined1 local_3538 [16];
  float local_3528;
  float fStack_3524;
  float fStack_3520;
  float fStack_351c;
  undefined1 local_3518 [16];
  undefined1 local_3508 [16];
  uint local_34f8;
  uint uStack_34f4;
  uint uStack_34f0;
  uint uStack_34ec;
  uint uStack_34e8;
  uint uStack_34e4;
  uint uStack_34e0;
  uint uStack_34dc;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  local_3740 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_3740->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar43 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar50 = ZEXT816(0) << 0x40;
    uVar13 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar50,5);
    uVar37 = vpcmpeqd_avx512vl(auVar43,(undefined1  [16])valid_i->field_0);
    uVar37 = ((byte)uVar13 & 0xf) & uVar37;
    bVar36 = (byte)uVar37;
    if (bVar36 != 0) {
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x40))->v;
      tray.dir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x50))->v;
      tray.dir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x60))->v;
      auVar45._8_4_ = 0x7fffffff;
      auVar45._0_8_ = 0x7fffffff7fffffff;
      auVar45._12_4_ = 0x7fffffff;
      auVar43 = vandps_avx(auVar45,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar41._8_4_ = 0x219392ef;
      auVar41._0_8_ = 0x219392ef219392ef;
      auVar41._12_4_ = 0x219392ef;
      uVar34 = vcmpps_avx512vl(auVar43,auVar41,1);
      bVar35 = (bool)((byte)uVar34 & 1);
      auVar42._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._0_4_;
      bVar35 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar42._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._4_4_;
      bVar35 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar42._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._8_4_;
      bVar35 = (bool)((byte)(uVar34 >> 3) & 1);
      auVar42._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._12_4_;
      auVar43 = vandps_avx(auVar45,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      uVar34 = vcmpps_avx512vl(auVar43,auVar41,1);
      bVar35 = (bool)((byte)uVar34 & 1);
      auVar39._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._16_4_;
      bVar35 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar39._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._20_4_;
      bVar35 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar39._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._24_4_;
      bVar35 = (bool)((byte)(uVar34 >> 3) & 1);
      auVar39._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._28_4_;
      auVar43 = vandps_avx(auVar45,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      uVar34 = vcmpps_avx512vl(auVar43,auVar41,1);
      bVar35 = (bool)((byte)uVar34 & 1);
      auVar40._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._32_4_;
      bVar35 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar40._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._36_4_;
      bVar35 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar40._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._40_4_;
      bVar35 = (bool)((byte)(uVar34 >> 3) & 1);
      auVar40._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * tray.dir.field_0._44_4_;
      auVar41 = vrcp14ps_avx512vl(auVar42);
      auVar44._8_4_ = 0x3f800000;
      auVar44._0_8_ = 0x3f8000003f800000;
      auVar44._12_4_ = 0x3f800000;
      auVar43 = vfnmadd213ps_fma(auVar42,auVar41,auVar44);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar43,auVar41,auVar41)
      ;
      auVar42 = vrcp14ps_avx512vl(auVar39);
      auVar43 = vfnmadd213ps_fma(auVar39,auVar42,auVar44);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar43,auVar42,auVar42)
      ;
      auVar42 = vrcp14ps_avx512vl(auVar40);
      auVar43 = vfnmadd213ps_fma(auVar40,auVar42,auVar44);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar43,auVar42,auVar42)
      ;
      uVar34 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar50,1);
      auVar43 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar34 >> 1) & 1) * auVar43._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar34 & 1) * auVar43._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar34 >> 2) & 1) * auVar43._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar34 >> 3) & 1) * auVar43._12_4_;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      uVar34 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar50,5);
      auVar43 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar35 = (bool)((byte)uVar34 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar35 * auVar43._0_4_ | (uint)!bVar35 * 0x60;
      bVar35 = (bool)((byte)(uVar34 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar35 * auVar43._4_4_ | (uint)!bVar35 * 0x60;
      bVar35 = (bool)((byte)(uVar34 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar35 * auVar43._8_4_ | (uint)!bVar35 * 0x60;
      bVar35 = (bool)((byte)(uVar34 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar35 * auVar43._12_4_ | (uint)!bVar35 * 0x60;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      uVar34 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar50,5);
      auVar43 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar35 = (bool)((byte)uVar34 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar35 * auVar43._0_4_ | (uint)!bVar35 * 0xa0;
      bVar35 = (bool)((byte)(uVar34 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar35 * auVar43._4_4_ | (uint)!bVar35 * 0xa0;
      bVar35 = (bool)((byte)(uVar34 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar35 * auVar43._8_4_ | (uint)!bVar35 * 0xa0;
      bVar35 = (bool)((byte)(uVar34 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar35 * auVar43._12_4_ | (uint)!bVar35 * 0xa0;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar72 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar43 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar50);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar36 & 1) * auVar43._0_4_ |
           (uint)!(bool)(bVar36 & 1) * stack_near[0].field_0._0_4_;
      bVar35 = (bool)((byte)(uVar37 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar35 * auVar43._4_4_ | (uint)!bVar35 * stack_near[0].field_0._4_4_;
      bVar35 = (bool)((byte)(uVar37 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar35 * auVar43._8_4_ | (uint)!bVar35 * stack_near[0].field_0._8_4_;
      bVar35 = SUB81(uVar37 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar35 * auVar43._12_4_ | (uint)!bVar35 * stack_near[0].field_0._12_4_;
      auVar43 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar50);
      tray.tfar.field_0.i[0] =
           (uint)(bVar36 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar36 & 1) * -0x800000;
      bVar35 = (bool)((byte)(uVar37 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar35 * auVar43._4_4_ | (uint)!bVar35 * -0x800000;
      bVar35 = (bool)((byte)(uVar37 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar35 * auVar43._8_4_ | (uint)!bVar35 * -0x800000;
      bVar35 = SUB81(uVar37 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar35 * auVar43._12_4_ | (uint)!bVar35 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar30 = 3;
      }
      else {
        uVar30 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      bVar23 = (byte)((ushort)((short)uVar37 << 0xc) >> 0xc) ^ 0xf;
      pNVar31 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar32 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar73 = ZEXT1664(auVar43);
      auVar43 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
      auVar74 = ZEXT1664(auVar43);
      local_3738 = This;
LAB_01f4f4df:
      do {
        do {
          root.ptr = pNVar31[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01f4fd3c;
          pNVar31 = pNVar31 + -1;
          paVar32 = paVar32 + -1;
          vVar7.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar32->v;
          auVar54 = ZEXT1664((undefined1  [16])vVar7.field_0);
          uVar37 = vcmpps_avx512vl((undefined1  [16])vVar7.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar37 == '\0');
        uVar33 = (undefined4)uVar37;
        if (uVar30 < (uint)POPCOUNT(uVar33)) {
LAB_01f4f527:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01f4fd3c;
              uVar13 = vcmpps_avx512vl(auVar54._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar13 == '\0') goto LAB_01f4f4df;
              bVar22 = bVar23 & 0xf;
              local_3730 = (ulong)((uint)root.ptr & 0xf) - 8;
              if (local_3730 == 0) goto LAB_01f4fd0e;
              bVar22 = bVar22 ^ 0xf;
              lVar29 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
              uVar37 = 0;
              goto LAB_01f4f7f0;
            }
            lVar29 = 0;
            sVar27 = 8;
            auVar43 = auVar72._0_16_;
            do {
              sVar26 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar29 * 8);
              if (sVar26 == 8) {
                auVar54 = ZEXT1664(auVar43);
                sVar26 = sVar27;
                break;
              }
              auVar20._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar20._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar20._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar20._12_4_ = tray.org_rdir.field_0._12_4_;
              uVar33 = *(undefined4 *)(root.ptr + 0x40 + lVar29 * 4);
              auVar57._4_4_ = uVar33;
              auVar57._0_4_ = uVar33;
              auVar57._8_4_ = uVar33;
              auVar57._12_4_ = uVar33;
              auVar39 = vfmsub132ps_fma(auVar57,auVar20,
                                        (undefined1  [16])tray.rdir.field_0.field_0.x.field_0);
              uVar33 = *(undefined4 *)(root.ptr + 0x80 + lVar29 * 4);
              auVar61._4_4_ = uVar33;
              auVar61._0_4_ = uVar33;
              auVar61._8_4_ = uVar33;
              auVar61._12_4_ = uVar33;
              auVar21._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar21._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar21._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar21._12_4_ = tray.org_rdir.field_0._44_4_;
              uVar33 = *(undefined4 *)(root.ptr + 0xc0 + lVar29 * 4);
              auVar66._4_4_ = uVar33;
              auVar66._0_4_ = uVar33;
              auVar66._8_4_ = uVar33;
              auVar66._12_4_ = uVar33;
              auVar40 = vfmsub132ps_fma(auVar61,(undefined1  [16])
                                                tray.org_rdir.field_0.field_0.y.field_0,
                                        (undefined1  [16])tray.rdir.field_0.field_0.y.field_0);
              auVar41 = vfmsub132ps_fma(auVar66,auVar21,
                                        (undefined1  [16])tray.rdir.field_0.field_0.z.field_0);
              uVar33 = *(undefined4 *)(root.ptr + 0x60 + lVar29 * 4);
              auVar15._4_4_ = uVar33;
              auVar15._0_4_ = uVar33;
              auVar15._8_4_ = uVar33;
              auVar15._12_4_ = uVar33;
              auVar44 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar20,
                                   auVar15);
              uVar33 = *(undefined4 *)(root.ptr + 0xa0 + lVar29 * 4);
              auVar16._4_4_ = uVar33;
              auVar16._0_4_ = uVar33;
              auVar16._8_4_ = uVar33;
              auVar16._12_4_ = uVar33;
              auVar45 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,
                                   (undefined1  [16])tray.org_rdir.field_0.field_0.y.field_0,auVar16
                                  );
              uVar33 = *(undefined4 *)(root.ptr + 0xe0 + lVar29 * 4);
              auVar17._4_4_ = uVar33;
              auVar17._0_4_ = uVar33;
              auVar17._8_4_ = uVar33;
              auVar17._12_4_ = uVar33;
              auVar46 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar21,
                                   auVar17);
              auVar50 = vpminsd_avx(auVar39,auVar44);
              auVar42 = vpminsd_avx(auVar40,auVar45);
              auVar50 = vpmaxsd_avx(auVar50,auVar42);
              auVar42 = vpminsd_avx(auVar41,auVar46);
              auVar50 = vpmaxsd_avx(auVar50,auVar42);
              auVar42 = vpmaxsd_avx(auVar39,auVar44);
              auVar39 = vpmaxsd_avx(auVar40,auVar45);
              auVar39 = vpminsd_avx(auVar42,auVar39);
              auVar42 = vpmaxsd_avx(auVar41,auVar46);
              auVar39 = vpminsd_avx(auVar39,auVar42);
              auVar42 = vpmaxsd_avx(auVar50,(undefined1  [16])tray.tnear.field_0);
              auVar39 = vpminsd_avx(auVar39,(undefined1  [16])tray.tfar.field_0);
              uVar37 = vpcmpd_avx512vl(auVar42,auVar39,2);
              uVar37 = uVar37 & 0xf;
              if ((byte)uVar37 == 0) {
                auVar54 = ZEXT1664(auVar43);
                sVar26 = sVar27;
              }
              else {
                auVar42 = vblendmps_avx512vl(auVar72._0_16_,auVar50);
                bVar35 = (bool)((byte)uVar37 & 1);
                bVar10 = (bool)((byte)(uVar37 >> 1) & 1);
                bVar11 = (bool)((byte)(uVar37 >> 2) & 1);
                bVar12 = SUB81(uVar37 >> 3,0);
                auVar54 = ZEXT1664(CONCAT412((uint)bVar12 * auVar42._12_4_ |
                                             (uint)!bVar12 * auVar50._12_4_,
                                             CONCAT48((uint)bVar11 * auVar42._8_4_ |
                                                      (uint)!bVar11 * auVar50._8_4_,
                                                      CONCAT44((uint)bVar10 * auVar42._4_4_ |
                                                               (uint)!bVar10 * auVar50._4_4_,
                                                               (uint)bVar35 * auVar42._0_4_ |
                                                               (uint)!bVar35 * auVar50._0_4_))));
                if (sVar27 != 8) {
                  pNVar31->ptr = sVar27;
                  pNVar31 = pNVar31 + 1;
                  *(undefined1 (*) [16])paVar32->v = auVar43;
                  paVar32 = paVar32 + 1;
                }
              }
              lVar29 = lVar29 + 1;
              auVar43 = auVar54._0_16_;
              sVar27 = sVar26;
            } while (lVar29 != 8);
            iVar24 = 4;
            if (sVar26 == 8) goto LAB_01f4f69c;
            uVar13 = vcmpps_avx512vl((undefined1  [16])auVar54._0_16_,
                                     (undefined1  [16])tray.tfar.field_0,9);
            root.ptr = sVar26;
          } while ((byte)uVar30 < (byte)POPCOUNT((int)uVar13));
          pNVar31->ptr = sVar26;
          pNVar31 = pNVar31 + 1;
          *paVar32 = auVar54._0_16_;
          paVar32 = paVar32 + 1;
        }
        else {
          do {
            sVar27 = 0;
            for (uVar34 = uVar37; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
              sVar27 = sVar27 + 1;
            }
            bVar35 = occluded1(local_3738,local_3740,root,sVar27,&pre,ray,&tray,context);
            bVar22 = (byte)(1 << ((uint)sVar27 & 0x1f));
            if (!bVar35) {
              bVar22 = 0;
            }
            bVar23 = bVar23 | bVar22;
            uVar37 = uVar37 - 1 & uVar37;
          } while (uVar37 != 0);
          iVar24 = 3;
          if (bVar23 != 0xf) {
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)(bVar23 & 1) * auVar43._0_4_ |
                 (uint)!(bool)(bVar23 & 1) * tray.tfar.field_0.i[0];
            bVar35 = (bool)(bVar23 >> 1 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar35 * auVar43._4_4_ | (uint)!bVar35 * tray.tfar.field_0.i[1];
            bVar35 = (bool)(bVar23 >> 2 & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar35 * auVar43._8_4_ | (uint)!bVar35 * tray.tfar.field_0.i[2];
            bVar35 = (bool)(bVar23 >> 3 & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar35 * auVar43._12_4_ | (uint)!bVar35 * tray.tfar.field_0.i[3];
            iVar24 = 2;
          }
          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar72 = ZEXT1664(auVar43);
          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar73 = ZEXT1664(auVar43);
          auVar43 = vxorps_avx512vl(auVar74._0_16_,auVar74._0_16_);
          auVar74 = ZEXT1664(auVar43);
          auVar54 = ZEXT1664((undefined1  [16])vVar7.field_0);
          if (uVar30 < (uint)POPCOUNT(uVar33)) goto LAB_01f4f527;
        }
LAB_01f4f69c:
      } while ((iVar24 == 4) || (iVar24 == 2));
LAB_01f4fd3c:
      bVar23 = bVar23 & bVar36;
      bVar35 = (bool)(bVar23 >> 1 & 1);
      bVar10 = (bool)(bVar23 >> 2 & 1);
      *(uint *)pRVar1 = (uint)(bVar23 & 1) * -0x800000 | (uint)!(bool)(bVar23 & 1) * *(int *)pRVar1;
      *(uint *)(ray + 0x84) = (uint)bVar35 * -0x800000 | (uint)!bVar35 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar10 * -0x800000 | (uint)!bVar10 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar23 >> 3) * -0x800000 | (uint)!(bool)(bVar23 >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
  while( true ) {
    uVar37 = uVar37 + 1;
    lVar29 = lVar29 + 0xb0;
    if (local_3730 <= uVar37) break;
LAB_01f4f7f0:
    uVar34 = 0;
    bVar28 = bVar22;
    while (uVar38 = (ulong)*(uint *)(lVar29 + -0x10 + uVar34 * 4), uVar38 != 0xffffffff) {
      uVar33 = *(undefined4 *)(lVar29 + -0xa0 + uVar34 * 4);
      auVar52._4_4_ = uVar33;
      auVar52._0_4_ = uVar33;
      auVar52._8_4_ = uVar33;
      auVar52._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar29 + -0x90 + uVar34 * 4);
      auVar49._4_4_ = uVar33;
      auVar49._0_4_ = uVar33;
      auVar49._8_4_ = uVar33;
      auVar49._12_4_ = uVar33;
      uVar33 = *(undefined4 *)(lVar29 + -0x80 + uVar34 * 4);
      auVar58._4_4_ = uVar33;
      auVar58._0_4_ = uVar33;
      auVar58._8_4_ = uVar33;
      auVar58._12_4_ = uVar33;
      fVar2 = *(float *)(lVar29 + -0x70 + uVar34 * 4);
      auVar62._4_4_ = fVar2;
      auVar62._0_4_ = fVar2;
      auVar62._8_4_ = fVar2;
      auVar62._12_4_ = fVar2;
      uVar33 = *(undefined4 *)(lVar29 + -0x60 + uVar34 * 4);
      auVar67._4_4_ = uVar33;
      auVar67._0_4_ = uVar33;
      auVar67._8_4_ = uVar33;
      auVar67._12_4_ = uVar33;
      fVar3 = *(float *)(lVar29 + -0x50 + uVar34 * 4);
      auVar48._4_4_ = fVar3;
      auVar48._0_4_ = fVar3;
      auVar48._8_4_ = fVar3;
      auVar48._12_4_ = fVar3;
      fVar4 = *(float *)(lVar29 + -0x40 + uVar34 * 4);
      auVar60._4_4_ = fVar4;
      auVar60._0_4_ = fVar4;
      auVar60._8_4_ = fVar4;
      auVar60._12_4_ = fVar4;
      fVar5 = *(float *)(lVar29 + -0x30 + uVar34 * 4);
      auVar71._4_4_ = fVar5;
      auVar71._0_4_ = fVar5;
      auVar71._8_4_ = fVar5;
      auVar71._12_4_ = fVar5;
      auVar47 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar29 + -0x20 + uVar34 * 4)));
      auVar43 = vmulss_avx512f(auVar67,auVar47);
      auVar43._4_4_ = auVar43._0_4_;
      auVar43._8_4_ = auVar43._0_4_;
      auVar43._12_4_ = auVar43._0_4_;
      auVar44 = vfmsub231ps_fma(auVar43,auVar71,auVar48);
      fVar4 = fVar3 * fVar4;
      auVar50._4_4_ = fVar4;
      auVar50._0_4_ = fVar4;
      auVar50._8_4_ = fVar4;
      auVar50._12_4_ = fVar4;
      auVar48 = vfmsub231ps_avx512vl(auVar50,auVar47,auVar62);
      fVar5 = fVar5 * fVar2;
      auVar46._4_4_ = fVar5;
      auVar46._0_4_ = fVar5;
      auVar46._8_4_ = fVar5;
      auVar46._12_4_ = fVar5;
      auVar45 = vfmsub231ps_fma(auVar46,auVar60,auVar67);
      auVar39 = vsubps_avx(auVar52,*(undefined1 (*) [16])ray);
      auVar40 = vsubps_avx(auVar49,*(undefined1 (*) [16])(ray + 0x10));
      auVar41 = vsubps_avx(auVar58,*(undefined1 (*) [16])(ray + 0x20));
      auVar43 = *(undefined1 (*) [16])(ray + 0x40);
      auVar50 = *(undefined1 (*) [16])(ray + 0x50);
      auVar42 = *(undefined1 (*) [16])(ray + 0x60);
      auVar46 = vmulps_avx512vl(auVar50,auVar41);
      auVar46 = vfmsub231ps_fma(auVar46,auVar40,auVar42);
      auVar69._0_4_ = auVar42._0_4_ * auVar39._0_4_;
      auVar69._4_4_ = auVar42._4_4_ * auVar39._4_4_;
      auVar69._8_4_ = auVar42._8_4_ * auVar39._8_4_;
      auVar69._12_4_ = auVar42._12_4_ * auVar39._12_4_;
      auVar52 = vfmsub231ps_fma(auVar69,auVar41,auVar43);
      auVar70._0_4_ = auVar43._0_4_ * auVar40._0_4_;
      auVar70._4_4_ = auVar43._4_4_ * auVar40._4_4_;
      auVar70._8_4_ = auVar43._8_4_ * auVar40._8_4_;
      auVar70._12_4_ = auVar43._12_4_ * auVar40._12_4_;
      auVar49 = vfmsub231ps_avx512vl(auVar70,auVar39,auVar50);
      auVar59._0_4_ = auVar45._0_4_ * auVar42._0_4_;
      auVar59._4_4_ = auVar45._4_4_ * auVar42._4_4_;
      auVar59._8_4_ = auVar45._8_4_ * auVar42._8_4_;
      auVar59._12_4_ = auVar45._12_4_ * auVar42._12_4_;
      auVar50 = vfmadd231ps_avx512vl(auVar59,auVar48,auVar50);
      auVar43 = vfmadd231ps_fma(auVar50,auVar44,auVar43);
      auVar42 = vandps_avx512vl(auVar43,auVar73._0_16_);
      auVar50 = vmulps_avx512vl(auVar47,auVar49);
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar52,auVar71);
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar46,auVar60);
      auVar50 = vxorps_avx512vl(auVar42,auVar50);
      auVar47 = auVar74._0_16_;
      uVar13 = vcmpps_avx512vl(auVar50,auVar47,5);
      bVar25 = (byte)uVar13 & bVar28;
      if (bVar25 == 0) {
LAB_01f4f8fa:
        bVar25 = 0;
      }
      else {
        auVar68._0_4_ = fVar3 * auVar49._0_4_;
        auVar68._4_4_ = fVar3 * auVar49._4_4_;
        auVar68._8_4_ = fVar3 * auVar49._8_4_;
        auVar68._12_4_ = fVar3 * auVar49._12_4_;
        auVar52 = vfmadd213ps_fma(auVar52,auVar67,auVar68);
        auVar46 = vfmadd213ps_fma(auVar46,auVar62,auVar52);
        auVar63._0_4_ = auVar42._0_4_ ^ auVar46._0_4_;
        auVar63._4_4_ = auVar42._4_4_ ^ auVar46._4_4_;
        auVar63._8_4_ = auVar42._8_4_ ^ auVar46._8_4_;
        auVar63._12_4_ = auVar42._12_4_ ^ auVar46._12_4_;
        uVar13 = vcmpps_avx512vl(auVar63,auVar47,5);
        bVar25 = bVar25 & (byte)uVar13;
        if (bVar25 == 0) goto LAB_01f4f8fa;
        auVar19._8_4_ = 0x7fffffff;
        auVar19._0_8_ = 0x7fffffff7fffffff;
        auVar19._12_4_ = 0x7fffffff;
        auVar52 = vandps_avx512vl(auVar43,auVar19);
        auVar46 = vsubps_avx(auVar52,auVar50);
        uVar13 = vcmpps_avx512vl(auVar46,auVar63,5);
        bVar25 = bVar25 & (byte)uVar13;
        if (bVar25 == 0) goto LAB_01f4f8fa;
        auVar64._0_4_ = auVar41._0_4_ * auVar45._0_4_;
        auVar64._4_4_ = auVar41._4_4_ * auVar45._4_4_;
        auVar64._8_4_ = auVar41._8_4_ * auVar45._8_4_;
        auVar64._12_4_ = auVar41._12_4_ * auVar45._12_4_;
        auVar40 = vfmadd213ps_fma(auVar40,auVar48,auVar64);
        auVar39 = vfmadd213ps_fma(auVar39,auVar44,auVar40);
        auVar56._0_4_ = auVar52._0_4_ * *(float *)(ray + 0x30);
        auVar56._4_4_ = auVar52._4_4_ * *(float *)(ray + 0x34);
        auVar56._8_4_ = auVar52._8_4_ * *(float *)(ray + 0x38);
        auVar56._12_4_ = auVar52._12_4_ * *(float *)(ray + 0x3c);
        auVar55._0_4_ = auVar42._0_4_ ^ auVar39._0_4_;
        auVar55._4_4_ = auVar42._4_4_ ^ auVar39._4_4_;
        auVar55._8_4_ = auVar42._8_4_ ^ auVar39._8_4_;
        auVar55._12_4_ = auVar42._12_4_ ^ auVar39._12_4_;
        auVar65._0_4_ = auVar52._0_4_ * *(float *)(ray + 0x80);
        auVar65._4_4_ = auVar52._4_4_ * *(float *)(ray + 0x84);
        auVar65._8_4_ = auVar52._8_4_ * *(float *)(ray + 0x88);
        auVar65._12_4_ = auVar52._12_4_ * *(float *)(ray + 0x8c);
        uVar13 = vcmpps_avx512vl(auVar55,auVar65,2);
        uVar14 = vcmpps_avx512vl(auVar56,auVar55,1);
        bVar25 = bVar25 & (byte)uVar13 & (byte)uVar14;
        if (bVar25 == 0) {
LAB_01f4fcdf:
          bVar25 = 0;
          auVar45 = local_35d8;
          auVar48 = local_35c8;
          auVar44 = local_35b8;
          auVar52 = local_35a8;
          auVar55 = local_3598;
          auVar63 = _local_3588;
          auVar50 = _local_3578;
        }
        else {
          uVar13 = vcmpps_avx512vl(auVar43,ZEXT816(0) << 0x20,4);
          bVar25 = bVar25 & (byte)uVar13;
          if (bVar25 == 0) goto LAB_01f4fcdf;
        }
        _local_3578 = auVar50;
        _local_3588 = auVar63;
        local_3598 = auVar55;
        local_35a8 = auVar52;
        local_35b8 = auVar44;
        local_35c8 = auVar48;
        local_35d8 = auVar45;
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar72 = ZEXT1664(auVar43);
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar73 = ZEXT1664(auVar43);
        auVar43 = vxorps_avx512vl(auVar47,auVar47);
        auVar74 = ZEXT1664(auVar43);
      }
      auVar43 = auVar74._0_16_;
      pGVar8 = (context->scene->geometries).items[uVar38].ptr;
      uVar6 = pGVar8->mask;
      auVar47._4_4_ = uVar6;
      auVar47._0_4_ = uVar6;
      auVar47._8_4_ = uVar6;
      auVar47._12_4_ = uVar6;
      uVar13 = vptestmd_avx512vl(auVar47,*(undefined1 (*) [16])(ray + 0x90));
      bVar25 = (byte)uVar13 & 0xf & bVar25;
      if (bVar25 != 0) {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar50 = vrcp14ps_avx512vl(local_35a8);
          auVar18._8_4_ = 0x3f800000;
          auVar18._0_8_ = 0x3f8000003f800000;
          auVar18._12_4_ = 0x3f800000;
          auVar42 = vfnmadd213ps_avx512vl(auVar50,local_35a8,auVar18);
          auVar50 = vfmadd132ps_fma(auVar42,auVar50,auVar50);
          local_3538._0_4_ = auVar50._0_4_ * (float)local_3578._0_4_;
          local_3538._4_4_ = auVar50._4_4_ * (float)local_3578._4_4_;
          local_3538._8_4_ = auVar50._8_4_ * fStack_3570;
          local_3538._12_4_ = auVar50._12_4_ * fStack_356c;
          local_3528 = auVar50._0_4_ * (float)local_3588._0_4_;
          fStack_3524 = auVar50._4_4_ * (float)local_3588._4_4_;
          fStack_3520 = auVar50._8_4_ * fStack_3580;
          fStack_351c = auVar50._12_4_ * fStack_357c;
          local_3508 = vpbroadcastd_avx512vl();
          local_3518 = vpbroadcastd_avx512vl();
          local_3568 = local_35b8._0_8_;
          uStack_3560 = local_35b8._8_8_;
          local_3558 = local_35c8._0_8_;
          uStack_3550 = local_35c8._8_8_;
          local_3548 = local_35d8;
          vpcmpeqd_avx2(ZEXT1632(local_3538),ZEXT1632(local_3538));
          uStack_34f4 = context->user->instID[0];
          local_34f8 = uStack_34f4;
          uStack_34f0 = uStack_34f4;
          uStack_34ec = uStack_34f4;
          uStack_34e8 = context->user->instPrimID[0];
          uStack_34e4 = uStack_34e8;
          uStack_34e0 = uStack_34e8;
          uStack_34dc = uStack_34e8;
          local_3728 = *(int *)(ray + 0x80);
          iStack_3724 = *(int *)(ray + 0x84);
          iStack_3720 = *(int *)(ray + 0x88);
          iStack_371c = *(int *)(ray + 0x8c);
          auVar50 = vmulps_avx512vl(auVar50,local_3598);
          bVar35 = (bool)(bVar25 >> 1 & 1);
          bVar10 = (bool)(bVar25 >> 2 & 1);
          *(uint *)(ray + 0x80) =
               (uint)(bVar25 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar25 & 1) * local_3728;
          *(uint *)(ray + 0x84) = (uint)bVar35 * auVar50._4_4_ | (uint)!bVar35 * iStack_3724;
          *(uint *)(ray + 0x88) = (uint)bVar10 * auVar50._8_4_ | (uint)!bVar10 * iStack_3720;
          *(uint *)(ray + 0x8c) =
               (uint)(bVar25 >> 3) * auVar50._12_4_ | (uint)!(bool)(bVar25 >> 3) * iStack_371c;
          local_3758 = vpmovm2d_avx512vl((ulong)bVar25);
          args.valid = (int *)local_3758;
          args.geometryUserPtr = pGVar8->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_3568;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar8->occlusionFilterN)(&args);
            auVar43 = vxorps_avx512vl(auVar43,auVar43);
            auVar74 = ZEXT1664(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar73 = ZEXT1664(auVar43);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar72 = ZEXT1664(auVar43);
          }
          auVar43 = auVar74._0_16_;
          uVar38 = vptestmd_avx512vl(local_3758,local_3758);
          if ((uVar38 & 0xf) == 0) {
            uVar38 = 0;
          }
          else {
            p_Var9 = context->args->filter;
            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var9)(&args);
              auVar43 = vxorps_avx512vl(auVar43,auVar43);
              auVar74 = ZEXT1664(auVar43);
              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar73 = ZEXT1664(auVar43);
              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar72 = ZEXT1664(auVar43);
            }
            uVar38 = vptestmd_avx512vl(local_3758,local_3758);
            uVar38 = uVar38 & 0xf;
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar35 = (bool)((byte)uVar38 & 1);
            auVar51._0_4_ = (uint)bVar35 * auVar43._0_4_ | (uint)!bVar35 * *(int *)(args.ray + 0x80)
            ;
            bVar35 = (bool)((byte)(uVar38 >> 1) & 1);
            auVar51._4_4_ = (uint)bVar35 * auVar43._4_4_ | (uint)!bVar35 * *(int *)(args.ray + 0x84)
            ;
            bVar35 = (bool)((byte)(uVar38 >> 2) & 1);
            auVar51._8_4_ = (uint)bVar35 * auVar43._8_4_ | (uint)!bVar35 * *(int *)(args.ray + 0x88)
            ;
            bVar35 = SUB81(uVar38 >> 3,0);
            auVar51._12_4_ =
                 (uint)bVar35 * auVar43._12_4_ | (uint)!bVar35 * *(int *)(args.ray + 0x8c);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar51;
          }
          bVar25 = (byte)uVar38;
          auVar53._0_4_ =
               (uint)(bVar25 & 1) * *(int *)pRVar1 | (uint)!(bool)(bVar25 & 1) * local_3728;
          bVar35 = (bool)((byte)(uVar38 >> 1) & 1);
          auVar53._4_4_ = (uint)bVar35 * *(int *)(ray + 0x84) | (uint)!bVar35 * iStack_3724;
          bVar35 = (bool)((byte)(uVar38 >> 2) & 1);
          auVar53._8_4_ = (uint)bVar35 * *(int *)(ray + 0x88) | (uint)!bVar35 * iStack_3720;
          bVar35 = SUB81(uVar38 >> 3,0);
          auVar53._12_4_ = (uint)bVar35 * *(int *)(ray + 0x8c) | (uint)!bVar35 * iStack_371c;
          *(undefined1 (*) [16])pRVar1 = auVar53;
        }
        bVar28 = (bVar25 ^ 0xf) & bVar28;
      }
      if ((bVar28 == 0) || (bVar35 = 2 < uVar34, uVar34 = uVar34 + 1, bVar35)) break;
    }
    bVar22 = bVar22 & bVar28;
    if (bVar22 == 0) break;
  }
  bVar22 = bVar22 ^ 0xf;
LAB_01f4fd0e:
  bVar23 = bVar22 | bVar23;
  if (bVar23 == 0xf) {
    bVar23 = 0xf;
    goto LAB_01f4fd3c;
  }
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  tray.tfar.field_0.i[0] =
       (uint)(bVar23 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar23 & 1) * tray.tfar.field_0.i[0];
  bVar35 = (bool)(bVar23 >> 1 & 1);
  tray.tfar.field_0.i[1] = (uint)bVar35 * auVar43._4_4_ | (uint)!bVar35 * tray.tfar.field_0.i[1];
  bVar35 = (bool)(bVar23 >> 2 & 1);
  tray.tfar.field_0.i[2] = (uint)bVar35 * auVar43._8_4_ | (uint)!bVar35 * tray.tfar.field_0.i[2];
  bVar35 = (bool)(bVar23 >> 3 & 1);
  tray.tfar.field_0.i[3] = (uint)bVar35 * auVar43._12_4_ | (uint)!bVar35 * tray.tfar.field_0.i[3];
  goto LAB_01f4f4df;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }